

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O1

int cgltf_parse_json_texture_view
              (jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_texture_view *out_texture_view)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  cgltf_texture_transform *out_array;
  int iVar8;
  jsmntok_t *pjVar9;
  uint uVar10;
  cgltf_float cVar11;
  uint local_54;
  int local_50;
  
  if (tokens[(uint)i].type != JSMN_OBJECT) {
    return -1;
  }
  out_texture_view->scale = 1.0;
  lVar7 = 8;
  do {
    (out_texture_view->transform).offset[lVar7 + -5] = 1.0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  iVar1 = tokens[(uint)i].size;
  uVar10 = i + 1;
  if (0 < iVar1) {
    iVar8 = 0;
    while ((tokens[uVar10].type == JSMN_STRING && (pjVar9 = tokens + uVar10, pjVar9->size != 0))) {
      iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"index");
      if (iVar3 == 0) {
        iVar3 = cgltf_json_to_int(tokens + (long)(int)uVar10 + 1,json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar3 + 1);
LAB_003567ff:
        uVar10 = uVar10 + 2;
      }
      else {
        iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"texCoord");
        if (iVar3 == 0) {
          iVar3 = cgltf_json_to_int(tokens + (long)(int)uVar10 + 1,json_chunk);
          out_texture_view->texcoord = iVar3;
          goto LAB_003567ff;
        }
        iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"scale");
        if ((iVar3 == 0) || (iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"strength"), iVar3 == 0)) {
          cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar10 + 1,json_chunk);
          out_texture_view->scale = cVar11;
          goto LAB_003567ff;
        }
        iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"extras");
        if (iVar3 == 0) {
          (out_texture_view->extras).start_offset = (long)tokens[uVar10 + 1].start;
          (out_texture_view->extras).end_offset = (long)tokens[uVar10 + 1].end;
LAB_00356839:
          uVar10 = cgltf_skip_json(tokens,uVar10 + 1);
        }
        else {
          iVar3 = cgltf_json_strcmp(pjVar9,json_chunk,"extensions");
          if (iVar3 != 0) goto LAB_00356839;
          if (tokens[(long)(int)uVar10 + 1].type != JSMN_OBJECT) break;
          iVar3 = tokens[(long)(int)uVar10 + 1].size;
          uVar10 = uVar10 + 2;
          bVar2 = 0 < iVar3;
          uVar6 = local_54;
          if (0 < iVar3) {
            if (tokens[uVar10].type == JSMN_STRING) {
              pjVar9 = tokens + uVar10;
              local_50 = 0;
              do {
                if (pjVar9->size == 0) break;
                iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"KHR_texture_transform");
                if (iVar4 == 0) {
                  out_texture_view->has_transform = 1;
                  if (tokens[(long)(int)uVar10 + 1].type == JSMN_OBJECT) {
                    iVar4 = tokens[(long)(int)uVar10 + 1].size;
                    uVar10 = uVar10 + 2;
                    if (0 < iVar4) {
                      do {
                        iVar4 = iVar4 + -1;
                        if ((tokens[uVar10].type != JSMN_STRING) ||
                           (pjVar9 = tokens + uVar10, pjVar9->size == 0)) goto LAB_00356a10;
                        iVar5 = cgltf_json_strcmp(pjVar9,json_chunk,"offset");
                        out_array = &out_texture_view->transform;
                        if (iVar5 == 0) {
LAB_003569c8:
                          uVar10 = cgltf_parse_json_float_array
                                             (tokens,uVar10 + 1,json_chunk,out_array->offset,2);
                        }
                        else {
                          iVar5 = cgltf_json_strcmp(pjVar9,json_chunk,"rotation");
                          if (iVar5 == 0) {
                            cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar10 + 1,json_chunk);
                            (out_texture_view->transform).rotation = cVar11;
LAB_003569f3:
                            uVar10 = uVar10 + 2;
                          }
                          else {
                            iVar5 = cgltf_json_strcmp(pjVar9,json_chunk,"scale");
                            out_array = (cgltf_texture_transform *)
                                        (out_texture_view->transform).scale;
                            if (iVar5 == 0) goto LAB_003569c8;
                            iVar5 = cgltf_json_strcmp(pjVar9,json_chunk,"texCoord");
                            if (iVar5 == 0) {
                              iVar5 = cgltf_json_to_int(tokens + (long)(int)uVar10 + 1,json_chunk);
                              (out_texture_view->transform).texcoord = iVar5;
                              goto LAB_003569f3;
                            }
                            uVar10 = cgltf_skip_json(tokens,uVar10 + 1);
                          }
                        }
                      } while ((-1 < (int)uVar10) && (iVar4 != 0));
                    }
                  }
                  else {
LAB_00356a10:
                    uVar10 = 0xffffffff;
                  }
                }
                else {
                  uVar10 = cgltf_skip_json(tokens,uVar10 + 1);
                }
                uVar6 = uVar10;
                if ((int)uVar10 < 0) goto LAB_00356a4f;
                local_50 = local_50 + 1;
                bVar2 = local_50 < iVar3;
                uVar6 = local_54;
                if (local_50 == iVar3) goto LAB_00356a4f;
                pjVar9 = tokens + uVar10;
              } while (pjVar9->type == JSMN_STRING);
            }
            uVar6 = 0xffffffff;
          }
LAB_00356a4f:
          local_54 = uVar6;
          if (bVar2) {
            return uVar6;
          }
        }
      }
      if ((int)uVar10 < 0) {
        return uVar10;
      }
      iVar8 = iVar8 + 1;
      if (iVar8 == iVar1) {
        return uVar10;
      }
    }
    uVar10 = 0xffffffff;
  }
  return uVar10;
}

Assistant:

static int cgltf_parse_json_texture_view(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
    CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

    out_texture_view->scale = 1.0f;
    cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

    int size = tokens[i].size;
    ++i;

    for (int j = 0; j < size; ++j)
    {
        CGLTF_CHECK_KEY(tokens[i]);

        if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
        {
            ++i;
            out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
        {
            ++i;
            out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
        {
            i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
        {
            ++i;

            CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

            int extensions_size = tokens[i].size;
            ++i;

            for (int k = 0; k < extensions_size; ++k)
            {
                CGLTF_CHECK_KEY(tokens[i]);

                if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
                {
                    out_texture_view->has_transform = 1;
                    i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
                }
                else
                {
                    i = cgltf_skip_json(tokens, i+1);
                }

                if (i < 0)
                {
                    return i;
                }
            }
        }
        else
        {
            i = cgltf_skip_json(tokens, i + 1);
        }

        if (i < 0)
        {
            return i;
        }
    }

    return i;
}